

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O1

BOOL __thiscall Js::ModuleRoot::HasRootProperty(ModuleRoot *this,PropertyId propertyId)

{
  RecyclableObject *instance;
  BOOL BVar1;
  
  BVar1 = RootObjectBase::HasRootProperty(&this->super_RootObjectBase,propertyId);
  if (BVar1 != 0) {
    return 1;
  }
  instance = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
  if ((instance != (RecyclableObject *)0x0) &&
     (BVar1 = JavascriptOperators::HasProperty(instance,propertyId), BVar1 != 0)) {
    return 1;
  }
  BVar1 = GlobalObject::HasRootProperty
                    ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     globalObject.ptr,propertyId);
  return BVar1;
}

Assistant:

BOOL ModuleRoot::HasRootProperty(PropertyId propertyId)
    {
        if (__super::HasRootProperty(propertyId))
        {
            return TRUE;
        }
        else if (this->hostObject && JavascriptOperators::HasProperty(this->hostObject, propertyId))
        {
            return TRUE;
        }
        return this->GetLibrary()->GetGlobalObject()->GlobalObject::HasRootProperty(propertyId);
    }